

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

_Bool borg_shoot_scoot_safe(wchar_t emergency,wchar_t turns,wchar_t b_p)

{
  bitflag *flags;
  ushort uVar1;
  borg_grid *pbVar2;
  loc grid;
  loc_conflict grid1;
  monster_race *pmVar3;
  borg_kill *pbVar4;
  int iVar5;
  int iVar6;
  _Bool _Var7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  wchar_t wVar11;
  uint uVar12;
  wchar_t wVar13;
  loc_conflict grid2;
  int iVar14;
  char *pcVar15;
  wchar_t y;
  ulong uVar16;
  wchar_t X;
  ulong uVar17;
  long lVar18;
  
  if ((((borg.trait[0x23] < 8) || (borg.trait[0x69] != 0)) && (borg.trait[0xd2] != 0)) &&
     ((borg.trait[0x1a] != 0 &&
      (grid.y = borg.c.y, grid.x = borg.c.x, _Var7 = square_isvault(cave,grid), !_Var7)))) {
    _Var7 = borg_primarily_caster();
    if (_Var7) {
      if (((borg.trait[0x23] < 0x2d) || (0xe < borg.trait[0x1e])) &&
         ((0x2c < borg.trait[0x23] || (4 < borg.trait[0x1e])))) {
LAB_0021cb6c:
        if ((borg_morgoth_position == false) && (borg_as_position == false)) {
          lVar18 = 0;
          bVar8 = false;
          do {
            pbVar4 = borg_kills;
            pmVar3 = r_info;
            uVar16 = (ulong)borg_grids[(long)ddy_ddd[lVar18] + (long)borg.c.y]
                            [(long)ddx_ddd[lVar18] + (long)borg.c.x].kill;
            if (uVar16 != 0) {
              if (borg_kills[uVar16].awake == true) {
                uVar1 = borg_kills[uVar16].r_idx;
                flags = r_info[uVar1].flags;
                _Var7 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
                if ((((!_Var7) &&
                     (_Var7 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"), !_Var7))
                    && (_Var7 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL"), !_Var7))
                   && (borg.trait[0x23] <= (int)pbVar4[uVar16].power)) {
                  _Var7 = borg_spell_okay(MAGIC_MISSILE);
                  if (((_Var7) || (_Var7 = borg_spell_okay(ORB_OF_DRAINING), _Var7)) ||
                     (_Var7 = borg_spell_okay(NETHER_BOLT), _Var7)) {
                    bVar8 = true;
                  }
                  else {
                    wVar11 = borg_danger_one_kill
                                       (pbVar4[uVar16].pos.y,pbVar4[uVar16].pos.x,L'\x01',
                                        (wchar_t)lVar18,true,false);
                    if (((avoidance * 3) / 10 < wVar11) ||
                       ((((pmVar3[uVar1].friends != (monster_friends *)0x0 ||
                          (pmVar3[uVar1].friends_base != (monster_friends_base *)0x0)) &&
                         (borg.trait[0x23] + -5 <= (int)pbVar4[uVar16].level)) ||
                        ((((pbVar4[uVar16].ranged_attack != '\0' ||
                           (_Var7 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), _Var7)) ||
                          (_Var7 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), _Var7)
                          ) || (borg.trait[0x23] < 6)))))) {
                      bVar8 = true;
                    }
                  }
                }
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 8);
          wVar13 = L'\0';
          wVar11 = wVar13;
          if (bVar8) {
            iVar14 = 0;
            do {
              uVar12 = 0;
              do {
                do {
                  iVar6 = borg.c.y;
                  lVar18 = (long)borg.c.y;
                  uVar9 = Rand_div(0x15);
                  iVar5 = borg.c.x;
                  uVar16 = ((int)uVar9 + lVar18) - 10;
                  lVar18 = (long)borg.c.x;
                  uVar10 = Rand_div(0x15);
                  uVar17 = (lVar18 + (int)uVar10) - 10;
                  X = (wchar_t)uVar17;
                  y = (wchar_t)uVar16;
                  grid2 = loc(X,y);
                  grid1.y = borg.c.y;
                  grid1.x = borg.c.x;
                  wVar11 = distance(grid1,grid2);
                } while (5 < (uint)(wVar11 + L'\xfffffffb'));
                if ((0xffffffc0 < (uVar9 + iVar6) - 0x4a) && (0xffffff3c < (uVar10 + iVar5) - 0xce))
                {
                  pbVar2 = borg_grids[uVar16 & 0xffffffff];
                  if ((pbVar2[uVar17 & 0xffffffff].feat != '\0') &&
                     ((_Var7 = borg_cave_floor_bold(y,X), _Var7 &&
                      (pbVar2[uVar17 & 0xffffffff].kill == '\0')))) goto LAB_0021cf1b;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != 100);
              uVar12 = 100;
LAB_0021cf1b:
              if ((uVar12 < 100) && (wVar11 = borg_danger(y,X,turns,true,false), wVar11 <= b_p)) {
                lVar18 = 0;
                do {
                  if ((ulong)borg_grids[(long)ddy_ddd[lVar18] + uVar16]
                             [(long)ddx_ddd[lVar18] + uVar17].kill != 0) {
                    wVar13 = wVar13 + (uint)borg_kills
                                            [borg_grids[(long)ddy_ddd[lVar18] + uVar16]
                                             [(long)ddx_ddd[lVar18] + uVar17].kill].awake;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 8);
              }
              else {
                wVar13 = wVar13 + L'\x01';
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 != 100);
            wVar11 = (wchar_t)(wVar13 <= emergency);
            pcVar15 = "# No Shoot\'N\'Scoot. scary squares: %d/100";
            if (wVar13 <= emergency) {
              pcVar15 = "# Safe to Shoot\'N\'Scoot. scary squares: %d/100";
            }
            pcVar15 = format(pcVar15,(ulong)(uint)wVar13);
            borg_note(pcVar15);
          }
          goto LAB_0021cb20;
        }
      }
    }
    else if ((4 < borg.trait[0x9b]) && (borg.trait[0x23] < 0x2d)) goto LAB_0021cb6c;
  }
  wVar11 = L'\0';
LAB_0021cb20:
  return SUB41(wVar11,0);
}

Assistant:

bool borg_shoot_scoot_safe(int emergency, int turns, int b_p)
{
    int n, k, i, d, x, y, p, u;

    int dis               = 10;

    int min               = dis / 2;

    bool adjacent_monster = false;

    borg_grid           *ag;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    /* no need if high level in town */
    if (borg.trait[BI_CLEVEL] >= 8 && borg.trait[BI_CDEPTH] == 0)
        return false;

    /* must have the ability */
    if (!borg.trait[BI_APHASE])
        return false;

    /* Not if No Light */
    if (!borg.trait[BI_LIGHT])
        return false;

    /* Cheat the floor grid */
    /* Not if in a vault since it throws us out of the vault */
    if (square_isvault(cave, borg.c))
        return false;

    /*** Need Missiles or cheap spells ***/

    /* classes that are mainly spellcaster */
    if (borg_primarily_caster()) {
        /* Low mana */
        if (borg.trait[BI_CLEVEL] >= 45 && borg.trait[BI_CURSP] < 15)
            return false;

        /* Low mana, low level, generally OK */
        if (borg.trait[BI_CLEVEL] < 45 && borg.trait[BI_CURSP] < 5)
            return false;
    } else /* Other classes need some missiles */
    {
        if (borg.trait[BI_AMISSILES] < 5 || borg.trait[BI_CLEVEL] >= 45)
            return false;
    }

    /* Not if I am in a safe spot for killing special monsters */
    if (borg_morgoth_position || borg_as_position)
        return false;

    /* scan the adjacent grids for an awake monster */
    for (i = 0; i < 8; i++) {
        /* Grid in that direction */
        x = borg.c.x + ddx_ddd[i];
        y = borg.c.y + ddy_ddd[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Obtain the monster */
        kill  = &borg_kills[ag->kill];
        r_ptr = &r_info[kill->r_idx];

        /* If a qualifying monster is adjacent to me. */
        if ((ag->kill && kill->awake) && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))
            && !(rf_has(r_ptr->flags, RF_PASS_WALL))
            && !(rf_has(r_ptr->flags, RF_KILL_WALL))
            && (kill->power >= borg.trait[BI_CLEVEL])) {
            /* Spell casters shoot at everything */
            if (borg_spell_okay(MAGIC_MISSILE)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(ORB_OF_DRAINING)) {
                adjacent_monster = true;
            } else if (borg_spell_okay(NETHER_BOLT)) {
                adjacent_monster = true;
            }

            /* All other borgs need to make sure he would shoot.
             * In an effort to conserve missiles, the borg will
             * not shoot at certain types of monsters.  That list
             * is defined in borg_launch_damage_one().
             *
             * We need this aforementioned list to match the one
             * following.  Otherwise Rogues and Warriors will
             * burn up Phases as he scoots away but never fire
             * the missiles.  That totally defeats the purpose
             * of this routine.
             *
             * The following criteria are exactly the same as the
             * list in borg_launch_damage_one()
             */
            else if ((borg_danger_one_kill(
                          kill->pos.y, kill->pos.x, 1, i, true, false)
                         > avoidance * 3 / 10)
                     || ((r_ptr->friends
                             || r_ptr->friends_base) /* monster has friends*/
                         && kill->level
                                >= borg.trait[BI_CLEVEL] - 5 /* close levels */)
                     || (kill->ranged_attack /* monster has a ranged attack */)
                     || (rf_has(r_ptr->flags, RF_UNIQUE))
                     || (rf_has(r_ptr->flags, RF_MULTIPLY))
                     || (borg.trait[BI_CLEVEL] <= 5 /* still very weak */)) {
                adjacent_monster = true;
            }
        }
    }

    /* if No Adjacent_monster no need for it */
    if (adjacent_monster == false)
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 2))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 2))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids */
            if (ag->feat == FEAT_NONE)
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Stop looking.  Really, the game would keep
             * looking for a grid.  The borg could check
             * all the known grids but I don't think that
             * is not a good idea, especially if the area is
             * not fully explored.
             */
            break;
        }

        /* No location */
        /* In the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but we define it as dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine danger of that grid */
        p = borg_danger(y, x, turns, true, false);

        /* if more scary than my current one, do not allow jumps at all */
        if (p > b_p) {
            n++;
            continue;
        }

        /* Should not land next to a monster either.
         * Scan the adjacent grids for a monster.
         * Reuse the adjacent_monster variable.
         */
        for (u = 0; u < 8; u++) {
            /* Access the grid */
            ag = &borg_grids[y + ddy_ddd[u]][x + ddx_ddd[u]];

            /* Obtain the monster */
            kill = &borg_kills[ag->kill];

            /* If monster adjacent to that grid...
             */
            if (ag->kill && kill->awake)
                n++;
        }
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Shoot'N'Scoot. scary squares: %d/100", n));
        return false;
    } else
        borg_note(format("# Safe to Shoot'N'Scoot. scary squares: %d/100", n));

    /* Okay */
    return true;
}